

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall
wallet::wallet_tests::wallet_sync_tx_invalid_state_test::test_method
          (wallet_sync_tx_invalid_state_test *this)

{
  pointer *ppCVar1;
  long lVar2;
  Chain *chain;
  element_type *peVar3;
  string label;
  MockableData records;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *this_00;
  T *__rhs;
  CWalletTx *pCVar4;
  MockableDatabase *pMVar5;
  iterator pvVar6;
  iterator pvVar7;
  Txid *__args;
  long in_FS_OFFSET;
  Span<std::byte> output;
  CTransactionRef tx;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar8;
  undefined1 in_stack_fffffffffffff828;
  undefined1 in_stack_fffffffffffff829 [31];
  undefined1 in_stack_fffffffffffff848 [16];
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  undefined1 local_730 [16];
  assertion_result local_720;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 local_6e0 [24];
  char *local_6c8;
  char *local_6c0;
  undefined1 local_6b8 [16];
  pointer local_6a8;
  undefined1 local_6a0 [16];
  assertion_result local_690;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  Txid good_tx_id;
  undefined1 local_638 [16];
  undefined1 *local_628;
  undefined8 uStack_620;
  undefined1 local_610;
  long *local_600 [2];
  long local_5f0 [2];
  CMutableTransaction mtx;
  T op_dest;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_538;
  CWallet wallet;
  uint256 ret;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
          _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
          _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  ppCVar1 = &mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mtx,"");
  local_538._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_538._M_impl.super__Rb_tree_header._M_header;
  local_538._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_538._M_impl._0_8_ = 0;
  local_538._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_538._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_538._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._1_31_ = in_stack_fffffffffffff829;
  records._M_t._M_impl._0_1_ = in_stack_fffffffffffff828;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff848._0_8_;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff848._8_8_;
  local_538._M_impl.super__Rb_tree_header._M_header._M_right =
       local_538._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&local_6a8,records);
  CWallet::CWallet(&wallet,chain,(string *)&mtx,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_6a8);
  if (local_6a8 != (pointer)0x0) {
    (**(code **)(*(long *)(local_6a8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                + 8))();
  }
  local_6a8 = (pointer)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_538);
  if (mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppCVar1) {
    operator_delete(mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage)->prevout).hash.m_wrapped.
                            super_base_blob<256U>.m_data._M_elems + 1));
  }
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&wallet.cs_wallet;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&mtx);
  CWallet::SetWalletFlag(&wallet,0x400000000);
  CWallet::SetupDescriptorScriptPubKeyMans(&wallet);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&mtx);
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"");
  label._1_31_ = in_stack_fffffffffffff829;
  label._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff828;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)&mtx,&wallet,BECH32M,label);
  this_00 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                      ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                        *)&mtx,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                       ,0x3d3,"test_method","wallet.GetNewDestination(OutputType::BECH32M, \"\")");
  __rhs = util::
          Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          ::value(this_00);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&op_dest,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)__rhs);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)&mtx);
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  CMutableTransaction::CMutableTransaction(&mtx);
  GetScriptForDestination((CScript *)local_638,&op_dest);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx.vout,&COIN,(CScript *)local_638);
  if (0x1c < uStack_620._4_4_) {
    free((void *)local_638._0_8_);
    local_638._0_8_ = (char *)0x0;
  }
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&ret;
  FastRandomContext::fillrand
            (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng,
             output);
  local_628 = (undefined1 *)ret.super_base_blob<256U>.m_data._M_elems._16_8_;
  uStack_620 = (char *)ret.super_base_blob<256U>.m_data._M_elems._24_8_;
  local_638[0] = ret.super_base_blob<256U>.m_data._M_elems[0];
  local_638[1] = ret.super_base_blob<256U>.m_data._M_elems[1];
  local_638[2] = ret.super_base_blob<256U>.m_data._M_elems[2];
  local_638[3] = ret.super_base_blob<256U>.m_data._M_elems[3];
  local_638[4] = ret.super_base_blob<256U>.m_data._M_elems[4];
  local_638[5] = ret.super_base_blob<256U>.m_data._M_elems[5];
  local_638[6] = ret.super_base_blob<256U>.m_data._M_elems[6];
  local_638[7] = ret.super_base_blob<256U>.m_data._M_elems[7];
  local_638[8] = ret.super_base_blob<256U>.m_data._M_elems[8];
  local_638[9] = ret.super_base_blob<256U>.m_data._M_elems[9];
  local_638[10] = ret.super_base_blob<256U>.m_data._M_elems[10];
  local_638[0xb] = ret.super_base_blob<256U>.m_data._M_elems[0xb];
  local_638[0xc] = ret.super_base_blob<256U>.m_data._M_elems[0xc];
  local_638[0xd] = ret.super_base_blob<256U>.m_data._M_elems[0xd];
  local_638[0xe] = ret.super_base_blob<256U>.m_data._M_elems[0xe];
  local_638[0xf] = ret.super_base_blob<256U>.m_data._M_elems[0xf];
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (ulong)(uint)good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ << 0x20;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,(transaction_identifier<false> *)local_638,
             (int *)&good_tx_id);
  local_6b8._0_8_ = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6b8 + 8),
             (CTransaction **)local_6b8,(allocator<CTransaction> *)local_638,&mtx);
  local_610 = 1;
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6b8;
  pCVar4 = CWallet::AddToWallet
                     (&wallet,tx,(TxState *)&ret,(UpdateWalletTxFn *)0x1,false,
                      (bool)in_stack_fffffffffffff828);
  peVar3 = (pCVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ret.super_base_blob<256U>.m_data._M_elems._16_8_ != 0) {
    (*(code *)ret.super_base_blob<256U>.m_data._M_elems._16_8_)(&ret,&ret,3);
  }
  if ((pointer)local_6b8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b8._8_8_);
  }
  criticalblock74.super_unique_lock._8_8_ =
       criticalblock74.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock74.super_unique_lock._M_device = &wallet.cs_wallet.super_recursive_mutex;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock74.super_unique_lock);
  __args = &peVar3->hash;
  pCVar4 = CWallet::GetWalletTx(&wallet,&__args->m_wrapped);
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_6c0 = "";
  local_6e0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3de;
  file.m_begin = (iterator)&local_6c8;
  msg.m_end = pvVar7;
  msg.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_6e0 + 8),msg
            );
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cb0;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  good_tx_id.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_730._0_4_ = 2;
  local_6a0._0_8_ = CachedTxGetAvailableCredit(&wallet,pCVar4,(isminefilter *)local_730);
  criticalblock75.super_unique_lock._M_device = (mutex_type *)local_6a0;
  local_6a0._8_8_ = local_6e0;
  local_720.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((pointer)local_6a0._0_8_ == (pointer)0x5f5e100);
  local_6e0._0_8_ = 100000000;
  local_720.m_message.px = (element_type *)0x0;
  local_720.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_690._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_690.m_message.px = (element_type *)0xfb26f1;
  uStack_620 = (char *)&criticalblock75;
  local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
  local_638._0_8_ = &PTR__lazy_ostream_013d4050;
  local_628 = boost::unit_test::lazy_ostream::inst;
  ret.super_base_blob<256U>.m_data._M_elems._24_8_ = local_6a0 + 8;
  ret.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d4050;
  ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_720,(lazy_ostream *)&good_tx_id,1,2,REQUIRE,0xfb36f1,(size_t)&local_690,0x3de,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638,"1 * COIN",(TxState *)&ret);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_720 + 0x10));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock74.super_unique_lock);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (&mtx.vin,mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_638._0_8_ = local_638._0_8_ & 0xffffffff00000000;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>const&,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,__args,(int *)local_638);
  local_638._0_8_ = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_638 + 8),
             (CTransaction **)local_638,(allocator<CTransaction> *)&ret,&mtx);
  CWallet::transactionAddedToMempool(&wallet,(CTransactionRef *)local_638);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._8_8_);
  }
  CMutableTransaction::GetHash(&good_tx_id,&mtx);
  criticalblock75.super_unique_lock._M_device = &wallet.cs_wallet.super_recursive_mutex;
  criticalblock75.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock75.super_unique_lock);
  pCVar4 = CWallet::GetWalletTx(&wallet,&good_tx_id.m_wrapped);
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3ee;
  file_00.m_begin = (iterator)&local_6f0;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_700,
             msg_00);
  local_720.m_message.px = (element_type *)((ulong)local_720.m_message.px & 0xffffffffffffff00);
  local_720._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_720.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_708 = "";
  local_730._12_4_ = 2;
  local_6e0._0_8_ = CachedTxGetAvailableCredit(&wallet,pCVar4,(isminefilter *)(local_730 + 0xc));
  local_730._0_8_ = 100000000;
  local_690.m_message.px = (element_type *)0x0;
  local_690.m_message.pn.pi_ = (sp_counted_base *)0x0;
  criticalblock74.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_249fb50;
  criticalblock74.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
       + 0x65;
  local_6a0._8_8_ = local_6e0;
  local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
  local_638._0_8_ = &PTR__lazy_ostream_013d4050;
  local_628 = boost::unit_test::lazy_ostream::inst;
  uStack_620 = local_6a0 + 8;
  local_6a0._0_8_ = local_730;
  ret.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d4050;
  ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  ret.super_base_blob<256U>.m_data._M_elems._24_8_ = local_6a0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_690.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_6e0._0_8_ == 100000000);
  boost::test_tools::tt_detail::report_assertion
            (&local_690,(lazy_ostream *)&local_720,1,2,REQUIRE,0xfb3723,(size_t)&criticalblock74,
             0x3ee,(CTransactionRef *)local_638,"1 * COIN",(allocator<CTransaction> *)&ret);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_690 + 0x10));
  pCVar4 = CWallet::GetWalletTx(&wallet,&__args->m_wrapped);
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x3f2;
  file_01.m_begin = (iterator)&local_740;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_750,
             msg_01);
  local_720.m_message.px = (element_type *)((ulong)local_720.m_message.px & 0xffffffffffffff00);
  local_720._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_720.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_708 = "";
  local_730._12_4_ = 2;
  local_6e0._0_8_ = CachedTxGetAvailableCredit(&wallet,pCVar4,(isminefilter *)(local_730 + 0xc));
  local_730._0_8_ = 0;
  local_690.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_6e0._0_8_ == 0);
  local_690.m_message.px = (element_type *)0x0;
  local_690.m_message.pn.pi_ = (sp_counted_base *)0x0;
  criticalblock74.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_249fb50;
  criticalblock74.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
       + 0x65;
  local_6a0._8_8_ = local_6e0;
  local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
  local_638._0_8_ = &PTR__lazy_ostream_013d4050;
  local_628 = boost::unit_test::lazy_ostream::inst;
  uStack_620 = local_6a0 + 8;
  local_6a0._0_8_ = local_730;
  ret.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d4050;
  ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  ret.super_base_blob<256U>.m_data._M_elems._24_8_ = local_6a0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_690,(lazy_ostream *)&local_720,1,2,REQUIRE,0xfb36f1,(size_t)&criticalblock74,
             0x3f2,(CTransactionRef *)local_638,"0 * COIN",(allocator<CTransaction> *)&ret);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_690 + 0x10));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock75.super_unique_lock);
  pMVar5 = GetMockableDatabase(&wallet);
  pMVar5->m_pass = false;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (&mtx.vin,mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_638._0_8_ = local_638._0_8_ & 0xffffffff00000000;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>const&,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,&good_tx_id,(int *)local_638);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3fe;
  file_02.m_begin = (iterator)&local_760;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_770,
             msg_02);
  local_638._0_8_ = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_638 + 8),
             (CTransaction **)local_638,(allocator<CTransaction> *)&criticalblock74,&mtx);
  CWallet::transactionAddedToMempool(&wallet,(CTransactionRef *)local_638);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._8_8_);
  }
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar8 = 0x81ee8d;
  file_03.m_end = (iterator)0x3fe;
  file_03.m_begin = (iterator)&local_780;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_790,
             msg_03);
  ret.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ret.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffffffffff00;
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
  local_638._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_628 = boost::unit_test::lazy_ostream::inst;
  uStack_620 = "exception std::runtime_error expected but not raised";
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_798 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ret,(lazy_ostream *)local_638,1,1,WARN,_cVar8,(size_t)&local_7a0,
             0x3fe);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx.vin);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&op_dest);
  CWallet::~CWallet(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_sync_tx_invalid_state_test, TestingSetup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
    {
        LOCK(wallet.cs_wallet);
        wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        wallet.SetupDescriptorScriptPubKeyMans();
    }

    // Add tx to wallet
    const auto op_dest{*Assert(wallet.GetNewDestination(OutputType::BECH32M, ""))};

    CMutableTransaction mtx;
    mtx.vout.emplace_back(COIN, GetScriptForDestination(op_dest));
    mtx.vin.emplace_back(Txid::FromUint256(m_rng.rand256()), 0);
    const auto& tx_id_to_spend = wallet.AddToWallet(MakeTransactionRef(mtx), TxStateInMempool{})->GetHash();

    {
        // Cache and verify available balance for the wtx
        LOCK(wallet.cs_wallet);
        const CWalletTx* wtx_to_spend = wallet.GetWalletTx(tx_id_to_spend);
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *wtx_to_spend), 1 * COIN);
    }

    // Now the good case:
    // 1) Add a transaction that spends the previously created transaction
    // 2) Verify that the available balance of this new tx and the old one is updated (prev tx is marked dirty)

    mtx.vin.clear();
    mtx.vin.emplace_back(tx_id_to_spend, 0);
    wallet.transactionAddedToMempool(MakeTransactionRef(mtx));
    const auto good_tx_id{mtx.GetHash()};

    {
        // Verify balance update for the new tx and the old one
        LOCK(wallet.cs_wallet);
        const CWalletTx* new_wtx = wallet.GetWalletTx(good_tx_id.ToUint256());
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *new_wtx), 1 * COIN);

        // Now the old wtx
        const CWalletTx* wtx_to_spend = wallet.GetWalletTx(tx_id_to_spend);
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *wtx_to_spend), 0 * COIN);
    }

    // Now the bad case:
    // 1) Make db always fail
    // 2) Try to add a transaction that spends the previously created transaction and
    //    verify that we are not moving forward if the wallet cannot store it
    GetMockableDatabase(wallet).m_pass = false;
    mtx.vin.clear();
    mtx.vin.emplace_back(good_tx_id, 0);
    BOOST_CHECK_EXCEPTION(wallet.transactionAddedToMempool(MakeTransactionRef(mtx)),
                          std::runtime_error,
                          HasReason("DB error adding transaction to wallet, write failed"));
}